

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlb_helper.c
# Opt level: O0

uint32_t merge_syn_data_abort
                   (uint32_t template_syn,uint target_el,_Bool same_el,_Bool ea,_Bool s1ptw,
                   _Bool is_write,int fsc)

{
  undefined4 local_20;
  uint32_t syn;
  _Bool is_write_local;
  _Bool s1ptw_local;
  _Bool ea_local;
  _Bool same_el_local;
  uint target_el_local;
  uint32_t template_syn_local;
  
  if ((((template_syn & 0x1000000) == 0) || (target_el != 2)) || (s1ptw)) {
    local_20 = syn_data_abort_no_iss((uint)same_el,(uint)ea,0,(uint)s1ptw,(uint)is_write,fsc);
  }
  else {
    local_20 = syn_data_abort_with_iss
                         ((uint)same_el,0,0,0,0,0,(uint)ea,0,(uint)s1ptw,(uint)is_write,fsc,true);
    local_20 = template_syn | local_20;
  }
  return local_20;
}

Assistant:

static inline uint32_t merge_syn_data_abort(uint32_t template_syn,
                                            unsigned int target_el,
                                            bool same_el, bool ea,
                                            bool s1ptw, bool is_write,
                                            int fsc)
{
    uint32_t syn;

    /*
     * ISV is only set for data aborts routed to EL2 and
     * never for stage-1 page table walks faulting on stage 2.
     *
     * Furthermore, ISV is only set for certain kinds of load/stores.
     * If the template syndrome does not have ISV set, we should leave
     * it cleared.
     *
     * See ARMv8 specs, D7-1974:
     * ISS encoding for an exception from a Data Abort, the
     * ISV field.
     */
    if (!(template_syn & ARM_EL_ISV) || target_el != 2 || s1ptw) {
        syn = syn_data_abort_no_iss(same_el,
                                    ea, 0, s1ptw, is_write, fsc);
    } else {
        /*
         * Fields: IL, ISV, SAS, SSE, SRT, SF and AR come from the template
         * syndrome created at translation time.
         * Now we create the runtime syndrome with the remaining fields.
         */
        syn = syn_data_abort_with_iss(same_el,
                                      0, 0, 0, 0, 0,
                                      ea, 0, s1ptw, is_write, fsc,
                                      true);
        /* Merge the runtime syndrome with the template syndrome.  */
        syn |= template_syn;
    }
    return syn;
}